

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O2

void embree::updateEdgeLevelBuffer(ISPCSubdivMesh *mesh,Vec3fa *cam_pos,uint startID,uint endID)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  
  for (; startID < endID; startID = startID + 1) {
    uVar1 = mesh->face_offsets[startID];
    uVar5 = (ulong)mesh->verticesPerFace[startID];
    if (uVar5 == 4) {
      lVar2 = 0;
      while (lVar2 != 4) {
        uVar6 = (int)lVar2 + uVar1;
        fVar7 = updateEdgeLevel(mesh,cam_pos,uVar6,((uint)(lVar2 + 1) & 3) + uVar1);
        mesh->subdivlevel[uVar6] = fVar7;
        lVar2 = lVar2 + 1;
      }
    }
    else if (mesh->verticesPerFace[startID] == 3) {
      lVar2 = 0;
      while (lVar2 != 3) {
        uVar6 = uVar1 + (int)lVar2;
        iVar4 = (int)(lVar2 + 1);
        if (lVar2 == 2) {
          iVar4 = 0;
        }
        fVar7 = updateEdgeLevel(mesh,cam_pos,uVar6,iVar4 + uVar1);
        mesh->subdivlevel[uVar6] = fVar7;
        lVar2 = lVar2 + 1;
      }
    }
    else {
      uVar3 = 0;
      while (uVar5 != uVar3) {
        uVar6 = uVar1 + (int)uVar3;
        iVar4 = (int)(uVar3 + 1);
        if (uVar5 - 1 == uVar3) {
          iVar4 = 0;
        }
        fVar7 = updateEdgeLevel(mesh,cam_pos,uVar6,iVar4 + uVar1);
        mesh->subdivlevel[uVar6] = fVar7;
        uVar3 = uVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void updateEdgeLevelBuffer( ISPCSubdivMesh* mesh, const Vec3fa& cam_pos, unsigned int startID, unsigned int endID )
{
  for (unsigned int f=startID; f<endID;f++) {
    unsigned int e = mesh->face_offsets[f];
    unsigned int N = mesh->verticesPerFace[f];
    if (N == 4) /* fast path for quads */
      for (unsigned int i=0; i<4; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%4);
    else if (N == 3) /* fast path for triangles */
      for (unsigned int i=0; i<3; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%3);
    else /* fast path for general polygons */
      for (unsigned int i=0; i<N; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%N);
  }
}